

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fault.cc
# Opt level: O2

XMLWriter * __thiscall kratos::XMLWriter::attr<unsigned_int>(XMLWriter *this,string *key,uint value)

{
  XMLWriter *pXVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  format_args args;
  string_view format_str;
  ulong local_58 [2];
  string local_48;
  
  local_58[0] = (ulong)value;
  bVar2 = fmt::v7::to_string_view<char,_0>("{0}");
  format_str.data_ = (char *)bVar2.size_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_58;
  format_str.size_ = 2;
  fmt::v7::detail::vformat_abi_cxx11_(&local_48,(detail *)bVar2.data_,format_str,args);
  pXVar1 = attr(this,key,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return pXVar1;
}

Assistant:

XMLWriter &attr(const std::string &key, T value) {
        return attr(key, ::format("{0}", value));
    }